

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_header.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined4 in_register_0000003c;
  
  puVar2 = (undefined8 *)cmime_header_new(CONCAT44(in_register_0000003c,argc));
  if (puVar2 == (undefined8 *)0x0) {
    pcVar3 = "h";
    __line = 0x26;
  }
  else {
    cmime_header_set_name(puVar2,header_string1_key);
    iVar1 = strcmp((char *)*puVar2,header_string1_key);
    if (iVar1 == 0) {
      cmime_header_set_value(puVar2,header_string1_value,0);
      if (*(int *)(puVar2 + 2) == 1) {
        pcVar3 = (char *)cmime_header_get_value(puVar2,0);
        iVar1 = strcmp(pcVar3,header_string1_value);
        if (iVar1 == 0) {
          pcVar3 = (char *)cmime_header_to_string(puVar2);
          iVar1 = strcmp(pcVar3,header_string1);
          if (iVar1 == 0) {
            free(pcVar3);
            cmime_header_set_value(puVar2,header_string2_value,0);
            if (*(int *)(puVar2 + 2) == 2) {
              pcVar3 = (char *)cmime_header_get_value(puVar2,0);
              iVar1 = strcmp(pcVar3,header_string1_value);
              if (iVar1 == 0) {
                pcVar3 = (char *)cmime_header_get_value(puVar2,1);
                iVar1 = strcmp(pcVar3,header_string2_value);
                if (iVar1 == 0) {
                  cmime_header_set_value(puVar2,test_string1,1);
                  pcVar3 = (char *)cmime_header_get_value(puVar2,0);
                  iVar1 = strcmp(pcVar3,test_string1);
                  if (iVar1 == 0) {
                    if (*(int *)(puVar2 + 2) == 1) {
                      cmime_header_free(puVar2);
                      return 0;
                    }
                    pcVar3 = "count == 1";
                    __line = 0x4b;
                  }
                  else {
                    pcVar3 = "strcmp(s,test_string1)==0";
                    __line = 0x48;
                  }
                }
                else {
                  pcVar3 = "strcmp(s,header_string2_value)==0";
                  __line = 0x43;
                }
              }
              else {
                pcVar3 = "strcmp(s,header_string1_value)==0";
                __line = 0x3f;
              }
            }
            else {
              pcVar3 = "count == 2";
              __line = 0x3b;
            }
          }
          else {
            pcVar3 = "strcmp(s,header_string1)==0";
            __line = 0x35;
          }
        }
        else {
          pcVar3 = "strcmp(s,header_string1_value)==0";
          __line = 0x32;
        }
      }
      else {
        pcVar3 = "count == 1";
        __line = 0x2e;
      }
    }
    else {
      pcVar3 = "strcmp(s,header_string1_key)==0";
      __line = 0x2a;
    }
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_header.c"
                ,__line,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    CMimeHeader_T *h;
    char *s = NULL;
    int count;
    
    h = cmime_header_new();
    assert(h);
    
    cmime_header_set_name(h,header_string1_key);
    s = cmime_header_get_name(h);
    assert(strcmp(s,header_string1_key)==0);
    
    cmime_header_set_value(h,header_string1_value,0);
    count = cmime_header_get_count(h);
    assert(count == 1);

    // fetch first value
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,header_string1_value)==0);
        
    s = cmime_header_to_string(h);
    assert(strcmp(s,header_string1)==0);
    free(s);
        
    // add another header value
    cmime_header_set_value(h,header_string2_value,0);
    count = cmime_header_get_count(h);
    assert(count == 2);
        
    // check first value again
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,header_string1_value)==0);
        
    // check second value
    s = cmime_header_get_value(h,1);
    assert(strcmp(s,header_string2_value)==0);
    
    // now overwrite header values
    cmime_header_set_value(h,test_string1,1);
    s = cmime_header_get_value(h,0);
    assert(strcmp(s,test_string1)==0);
    
    count = cmime_header_get_count(h);
    assert(count == 1);
    
    cmime_header_free(h);
    return(0);
}